

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O0

void __thiscall
dlib::any_function<void_(),_void,_0UL>::derived<dlib::impl::image_display_functor,_void_()>::
~derived(derived<dlib::impl::image_display_functor,_void_()> *this)

{
  image_display_functor *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__derived_0055f420;
  impl::image_display_functor::~image_display_functor(in_RDI);
  Tbase<void_()>::~Tbase((Tbase<void_()> *)in_RDI);
  return;
}

Assistant:

DLIB_ANY_FUNCTION_DERIVED_BOILERPLATE

    virtual result_type evaluate (
    ) const { DLIB_ANY_FUNCTION_RETURN item(); }